

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::TextTreeRenderer::ToStreamInternal(TextTreeRenderer *this,RenderTree *root,ostream *ss)

{
  idx_t iVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t y;
  
  iVar1 = root->width;
  uVar2 = (this->config).node_render_width;
  uVar3 = uVar2 * iVar1;
  while ((uVar2 = uVar2 - 2, (this->config).maximum_render_width < uVar3 &&
         ((this->config).minimum_render_width <= uVar2))) {
    (this->config).node_render_width = uVar2;
    uVar3 = uVar3 + iVar1 * -2;
  }
  for (uVar2 = 0; uVar2 < root->height; uVar2 = uVar2 + 1) {
    RenderTopLayer(this,root,ss,uVar2);
    RenderBoxContent(this,root,ss,uVar2);
    RenderBottomLayer(this,root,ss,uVar2);
  }
  return;
}

Assistant:

void TextTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	while (root.width * config.node_render_width > config.maximum_render_width) {
		if (config.node_render_width - 2 < config.minimum_render_width) {
			break;
		}
		config.node_render_width -= 2;
	}

	for (idx_t y = 0; y < root.height; y++) {
		// start by rendering the top layer
		RenderTopLayer(root, ss, y);
		// now we render the content of the boxes
		RenderBoxContent(root, ss, y);
		// render the bottom layer of each of the boxes
		RenderBottomLayer(root, ss, y);
	}
}